

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

UGroup * duckdb_re2::MaybeParsePerlCCEscape(StringPiece *s,ParseFlags parse_flags)

{
  ulong uVar1;
  char *pcVar2;
  UGroup *pUVar3;
  StringPiece name;
  StringPiece local_28;
  
  if (-1 < (char)parse_flags) {
    return (UGroup *)0x0;
  }
  uVar1 = s->size_;
  if ((1 < uVar1) && (pcVar2 = s->data_, *pcVar2 == '\\')) {
    local_28.size_ = 2;
    local_28.data_ = pcVar2;
    pUVar3 = LookupGroup(&local_28,(UGroup *)perl_groups,6);
    if (pUVar3 != (UGroup *)0x0) {
      s->data_ = pcVar2 + 2;
      s->size_ = uVar1 - 2;
      return pUVar3;
    }
  }
  return (UGroup *)0x0;
}

Assistant:

const UGroup* MaybeParsePerlCCEscape(StringPiece* s, Regexp::ParseFlags parse_flags) {
  if (!(parse_flags & Regexp::PerlClasses))
    return NULL;
  if (s->size() < 2 || (*s)[0] != '\\')
    return NULL;
  // Could use StringPieceToRune, but there aren't
  // any non-ASCII Perl group names.
  StringPiece name(s->data(), 2);
  const UGroup *g = LookupPerlGroup(name);
  if (g == NULL)
    return NULL;
  s->remove_prefix(name.size());
  return g;
}